

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *makefile,
          string *tgt)

{
  string_view str;
  ulong uVar1;
  string local_148;
  string_view local_128;
  string local_118;
  undefined1 local_f8 [8];
  string tgt2;
  cmGlobalUnixMakefileGenerator3 *gg;
  string_view local_c0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  undefined1 local_29;
  string *local_28;
  string *tgt_local;
  string *makefile_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  string *cmd;
  
  local_29 = 0;
  local_28 = tgt;
  tgt_local = makefile;
  makefile_local = (string *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_60,"$(MAKE) $(MAKESILENT) -f ");
  local_c0 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)tgt_local);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_b0,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             local_c0,SHELL);
  cmAlphaNum::cmAlphaNum(&local_90,&local_b0);
  gg._3_1_ = 0x20;
  cmStrCat<char>(__return_storage_ptr__,&local_60,&local_90,(char *)((long)&gg + 3));
  std::__cxx11::string::~string((string *)&local_b0);
  tgt2.field_2._8_8_ = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)(tgt2.field_2._8_8_ + 0x10));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  }
  if ((*(byte *)(tgt2.field_2._8_8_ + 0x731) & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-$(MAKEFLAGS) ");
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmOutputConverter::MaybeRelativeToTopBinDir
              ((string *)local_f8,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               local_28);
    cmSystemTools::ConvertToOutputSlashes((string *)local_f8);
    if ((this->MakeCommandEscapeTargetTwice & 1U) != 0) {
      local_128 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_f8);
      cmOutputConverter::EscapeForShell_abi_cxx11_
                (&local_118,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,local_128,true,false,false,false,false);
      std::__cxx11::string::operator=((string *)local_f8,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_f8);
    cmOutputConverter::EscapeForShell_abi_cxx11_
              (&local_148,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               str,true,false,false,false,false);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(
  const std::string& makefile, const std::string& tgt)
{
  // Call make on the given file.
  std::string cmd = cmStrCat(
    "$(MAKE) $(MAKESILENT) -f ",
    this->ConvertToOutputFormat(makefile, cmOutputConverter::SHELL), ' ');

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  // Pass down verbosity level.
  if (!gg->MakeSilentFlag.empty()) {
    cmd += gg->MakeSilentFlag;
    cmd += " ";
  }

  // Most unix makes will pass the command line flags to make down to
  // sub-invoked makes via an environment variable.  However, some
  // makes do not support that, so you have to pass the flags
  // explicitly.
  if (gg->PassMakeflags) {
    cmd += "-$(MAKEFLAGS) ";
  }

  // Add the target.
  if (!tgt.empty()) {
    // The make target is always relative to the top of the build tree.
    std::string tgt2 = this->MaybeRelativeToTopBinDir(tgt);

    // The target may have been written with windows paths.
    cmSystemTools::ConvertToOutputSlashes(tgt2);

    // Escape one extra time if the make tool requires it.
    if (this->MakeCommandEscapeTargetTwice) {
      tgt2 = this->EscapeForShell(tgt2, true, false);
    }

    // The target name is now a string that should be passed verbatim
    // on the command line.
    cmd += this->EscapeForShell(tgt2, true, false);
  }
  return cmd;
}